

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O2

Cardinality __thiscall testing::Between(testing *this,int min,int max)

{
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  linked_ptr_internal extraout_RDX;
  Cardinality CVar4;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__CardinalityInterface_00140a88;
  iVar1 = 0;
  if (0 < min) {
    iVar1 = min;
  }
  *(int *)(puVar2 + 1) = iVar1;
  if (iVar1 <= max) {
    iVar1 = max;
  }
  *(int *)((long)puVar2 + 0xc) = iVar1;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (min < 0) {
    poVar3 = std::operator<<(local_198,"The invocation lower bound must be >= 0, ");
    poVar3 = std::operator<<(poVar3,"but is actually ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,min);
    std::operator<<(poVar3,".");
    std::__cxx11::stringbuf::str();
    internal::Expect(false,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/chunmeng[P]cmake-project-base/build_O2/googletest-src/googlemock/src/gmock-cardinalities.cc"
                     ,0x3a,&sStack_1c8);
  }
  else if (max < 0) {
    poVar3 = std::operator<<(local_198,"The invocation upper bound must be >= 0, ");
    poVar3 = std::operator<<(poVar3,"but is actually ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,max);
    std::operator<<(poVar3,".");
    std::__cxx11::stringbuf::str();
    internal::Expect(false,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/chunmeng[P]cmake-project-base/build_O2/googletest-src/googlemock/src/gmock-cardinalities.cc"
                     ,0x3e,&sStack_1c8);
  }
  else {
    if ((uint)min <= (uint)max) goto LAB_00121f00;
    poVar3 = std::operator<<(local_198,"The invocation upper bound (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,max);
    poVar3 = std::operator<<(poVar3,") must be >= the invocation lower bound (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,min);
    std::operator<<(poVar3,").");
    std::__cxx11::stringbuf::str();
    internal::Expect(false,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/chunmeng[P]cmake-project-base/build_O2/googletest-src/googlemock/src/gmock-cardinalities.cc"
                     ,0x43,&sStack_1c8);
  }
  std::__cxx11::string::~string((string *)&sStack_1c8);
LAB_00121f00:
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  *(undefined8 **)this = puVar2;
  *(testing **)(this + 8) = this + 8;
  CVar4.impl_.link_.next_ = extraout_RDX.next_;
  CVar4.impl_.value_ = (CardinalityInterface *)this;
  return (Cardinality)CVar4.impl_;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}